

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  LRUHandle **ppLVar1;
  long lVar2;
  char *__s1;
  size_t __n;
  int iVar3;
  LRUHandle *pLVar4;
  LRUHandle **ppLVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ppLVar5 = this->list_ + (this->length_ - 1 & hash);
  if (*ppLVar5 != (LRUHandle *)0x0) {
    __s1 = key->data_;
    __n = key->size_;
    pLVar4 = *ppLVar5;
    do {
      if (pLVar4->hash == hash) {
        if (pLVar4->next == pLVar4) {
          __assert_fail("next != this",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                        ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
        }
        if (__n == pLVar4->key_length) {
          iVar3 = bcmp(__s1,pLVar4->key_data,__n);
          if (iVar3 == 0) break;
        }
      }
      ppLVar1 = &pLVar4->next_hash;
      ppLVar5 = &pLVar4->next_hash;
      pLVar4 = *ppLVar1;
    } while (*ppLVar1 != (LRUHandle *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return ppLVar5;
  }
  __stack_chk_fail();
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }